

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_cfg.cpp
# Opt level: O0

spv_result_t spvtools::val::CfgPass(ValidationState_t *_,Instruction *inst)

{
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  ulong uVar1;
  uint32_t block_id;
  Op OVar2;
  BasicBlock *this;
  vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_> *this_00;
  size_type sVar3;
  DiagnosticStream *pDVar4;
  Function *pFVar5;
  allocator<char> local_3c1;
  string local_3c0;
  allocator<char> local_399;
  string local_398;
  allocator<char> local_371;
  string local_370;
  allocator<char> local_349;
  string local_348;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_328;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_310;
  DiagnosticStream local_2f8;
  Instruction *local_120;
  Instruction *return_type_inst;
  undefined1 local_110 [4];
  uint32_t return_type;
  spv_result_t local_f4;
  spv_result_t local_f0;
  uint local_ec;
  spv_result_t rcode_5;
  uint32_t target_1;
  size_t i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> cases;
  spv_result_t local_c0;
  spv_result_t local_bc;
  spv_result_t *local_b8;
  size_type local_b0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_a8;
  spv_result_t local_90;
  spv_result_t local_8c;
  spv_result_t rcode_4;
  spv_result_t rcode_3;
  uint32_t flabel;
  uint32_t tlabel;
  iterator local_78;
  size_type local_70;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  spv_result_t local_4c;
  uint local_48;
  spv_result_t rcode_2;
  uint32_t target;
  spv_result_t error_2;
  spv_result_t rcode_1;
  uint32_t merge_block_1;
  spv_result_t error_1;
  spv_result_t rcode;
  uint32_t continue_block;
  uint32_t merge_block;
  spv_result_t error;
  Op opcode;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  _error = inst;
  inst_local = (Instruction *)_;
  merge_block = Instruction::opcode(inst);
  if (merge_block == OpLoopMerge) {
    rcode = Instruction::GetOperandAs<unsigned_int>(_error,0);
    error_1 = Instruction::GetOperandAs<unsigned_int>(_error,1);
    merge_block_1 = MergeBlockAssert((ValidationState_t *)inst_local,rcode);
    if (merge_block_1 != SPV_SUCCESS) {
      return merge_block_1;
    }
    pFVar5 = ValidationState_t::current_function((ValidationState_t *)inst_local);
    __local._4_4_ = Function::RegisterLoopMerge(pFVar5,rcode,error_1);
    local_f4 = __local._4_4_;
  }
  else if (merge_block == OpSelectionMerge) {
    error_2 = Instruction::GetOperandAs<unsigned_int>(_error,0);
    target = MergeBlockAssert((ValidationState_t *)inst_local,error_2);
    if (target != SPV_SUCCESS) {
      return target;
    }
    pFVar5 = ValidationState_t::current_function((ValidationState_t *)inst_local);
    __local._4_4_ = Function::RegisterSelectionMerge(pFVar5,error_2);
    local_f4 = __local._4_4_;
  }
  else {
    if (merge_block == OpLabel) {
      pFVar5 = ValidationState_t::current_function((ValidationState_t *)inst_local);
      block_id = Instruction::id(_error);
      continue_block = Function::RegisterBlock(pFVar5,block_id,true);
      if (continue_block == SPV_SUCCESS) {
        pFVar5 = ValidationState_t::current_function((ValidationState_t *)inst_local);
        this = Function::current_block(pFVar5);
        BasicBlock::set_label(this,_error);
        return SPV_SUCCESS;
      }
      return continue_block;
    }
    if (merge_block == OpBranch) {
      local_48 = Instruction::GetOperandAs<unsigned_int>(_error,0);
      local_4c = FirstBlockAssert((ValidationState_t *)inst_local,local_48);
      if (local_4c == SPV_SUCCESS) {
        pFVar5 = ValidationState_t::current_function((ValidationState_t *)inst_local);
        tlabel = local_48;
        local_78 = &tlabel;
        local_70 = 1;
        std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&flabel + 3));
        __l_00._M_len = local_70;
        __l_00._M_array = local_78;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (&local_68,__l_00,(allocator_type *)((long)&flabel + 3));
        Function::RegisterBlockEnd(pFVar5,&local_68);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_68);
        std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&flabel + 3));
        return SPV_SUCCESS;
      }
      return local_4c;
    }
    if (merge_block == OpBranchConditional) {
      rcode_3 = Instruction::GetOperandAs<unsigned_int>(_error,1);
      rcode_4 = Instruction::GetOperandAs<unsigned_int>(_error,2);
      local_8c = FirstBlockAssert((ValidationState_t *)inst_local,rcode_3);
      if (local_8c != SPV_SUCCESS) {
        return local_8c;
      }
      local_90 = FirstBlockAssert((ValidationState_t *)inst_local,rcode_4);
      if (local_90 == SPV_SUCCESS) {
        pFVar5 = ValidationState_t::current_function((ValidationState_t *)inst_local);
        local_c0 = rcode_3;
        local_bc = rcode_4;
        local_b8 = &local_c0;
        local_b0 = 2;
        std::allocator<unsigned_int>::allocator
                  ((allocator<unsigned_int> *)
                   ((long)&cases.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        __l._M_len = local_b0;
        __l._M_array = (iterator)local_b8;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (&local_a8,__l,
                   (allocator_type *)
                   ((long)&cases.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        Function::RegisterBlockEnd(pFVar5,&local_a8);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_a8);
        std::allocator<unsigned_int>::~allocator
                  ((allocator<unsigned_int> *)
                   ((long)&cases.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        return SPV_SUCCESS;
      }
      return local_90;
    }
    if (merge_block != OpSwitch) {
      if (merge_block != OpKill) {
        if (merge_block == OpReturn) {
          pFVar5 = ValidationState_t::current_function((ValidationState_t *)inst_local);
          return_type_inst._4_4_ = Function::GetResultTypeId(pFVar5);
          local_120 = ValidationState_t::FindDef
                                ((ValidationState_t *)inst_local,return_type_inst._4_4_);
          if (local_120 == (Instruction *)0x0) {
            __assert_fail("return_type_inst",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_cfg.cpp"
                          ,0x48d,
                          "spv_result_t spvtools::val::CfgPass(ValidationState_t &, const Instruction *)"
                         );
          }
          OVar2 = Instruction::opcode(local_120);
          if (OVar2 == OpTypeVoid) {
            pFVar5 = ValidationState_t::current_function((ValidationState_t *)inst_local);
            memset(&local_310,0,0x18);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_310);
            Function::RegisterBlockEnd(pFVar5,&local_310);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_310);
            return SPV_SUCCESS;
          }
          ValidationState_t::diag
                    (&local_2f8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_CFG,_error);
          pDVar4 = DiagnosticStream::operator<<
                             (&local_2f8,
                              (char (*) [55])
                              "OpReturn can only be called from a function with void ");
          pDVar4 = DiagnosticStream::operator<<(pDVar4,(char (*) [13])0xd1a471);
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
          DiagnosticStream::~DiagnosticStream(&local_2f8);
          return __local._4_4_;
        }
        if ((((1 < merge_block - OpReturnValue) && (merge_block != OpTerminateInvocation)) &&
            (1 < merge_block - OpIgnoreIntersectionKHR)) && (merge_block != OpEmitMeshTasksEXT)) {
          return SPV_SUCCESS;
        }
      }
      pFVar5 = ValidationState_t::current_function((ValidationState_t *)inst_local);
      memset(&local_328,0,0x18);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_328);
      Function::RegisterBlockEnd(pFVar5,&local_328);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_328);
      if (merge_block == 0xfc) {
        pFVar5 = ValidationState_t::current_function((ValidationState_t *)inst_local);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_348,"OpKill requires Fragment execution model",&local_349);
        Function::RegisterExecutionModelLimitation(pFVar5,ExecutionModelFragment,&local_348);
        std::__cxx11::string::~string((string *)&local_348);
        std::allocator<char>::~allocator(&local_349);
      }
      if (merge_block == 0x1140) {
        pFVar5 = ValidationState_t::current_function((ValidationState_t *)inst_local);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_370,"OpTerminateInvocation requires Fragment execution model",
                   &local_371);
        Function::RegisterExecutionModelLimitation(pFVar5,ExecutionModelFragment,&local_370);
        std::__cxx11::string::~string((string *)&local_370);
        std::allocator<char>::~allocator(&local_371);
      }
      if (merge_block == 0x1160) {
        pFVar5 = ValidationState_t::current_function((ValidationState_t *)inst_local);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_398,"OpIgnoreIntersectionKHR requires AnyHitKHR execution model"
                   ,&local_399);
        Function::RegisterExecutionModelLimitation(pFVar5,AnyHitKHR,&local_398);
        std::__cxx11::string::~string((string *)&local_398);
        std::allocator<char>::~allocator(&local_399);
      }
      if (merge_block != 0x1161) {
        return SPV_SUCCESS;
      }
      pFVar5 = ValidationState_t::current_function((ValidationState_t *)inst_local);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3c0,"OpTerminateRayKHR requires AnyHitKHR execution model",
                 &local_3c1);
      Function::RegisterExecutionModelLimitation(pFVar5,AnyHitKHR,&local_3c0);
      std::__cxx11::string::~string((string *)&local_3c0);
      std::allocator<char>::~allocator(&local_3c1);
      return SPV_SUCCESS;
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
    _rcode_5 = 1;
    while( true ) {
      uVar1 = _rcode_5;
      this_00 = Instruction::operands(_error);
      sVar3 = std::vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>::size
                        (this_00);
      if (sVar3 <= uVar1) break;
      local_ec = Instruction::GetOperandAs<unsigned_int>(_error,_rcode_5);
      local_f0 = FirstBlockAssert((ValidationState_t *)inst_local,local_ec);
      if (local_f0 != SPV_SUCCESS) {
        local_f4 = SPV_UNSUPPORTED;
        __local._4_4_ = local_f0;
        goto LAB_00b47eba;
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,&local_ec);
      _rcode_5 = _rcode_5 + 2;
    }
    pFVar5 = ValidationState_t::current_function((ValidationState_t *)inst_local);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_110,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
    Function::RegisterBlockEnd
              (pFVar5,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_110);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_110);
    local_f4 = SPV_SUCCESS;
LAB_00b47eba:
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
  }
  if (local_f4 == SPV_SUCCESS) {
    return SPV_SUCCESS;
  }
  return __local._4_4_;
}

Assistant:

spv_result_t CfgPass(ValidationState_t& _, const Instruction* inst) {
  spv::Op opcode = inst->opcode();
  switch (opcode) {
    case spv::Op::OpLabel:
      if (auto error = _.current_function().RegisterBlock(inst->id()))
        return error;

      // TODO(github:1661) This should be done in the
      // ValidationState::RegisterInstruction method but because of the order of
      // passes the OpLabel ends up not being part of the basic block it starts.
      _.current_function().current_block()->set_label(inst);
      break;
    case spv::Op::OpLoopMerge: {
      uint32_t merge_block = inst->GetOperandAs<uint32_t>(0);
      uint32_t continue_block = inst->GetOperandAs<uint32_t>(1);
      CFG_ASSERT(MergeBlockAssert, merge_block);

      if (auto error = _.current_function().RegisterLoopMerge(merge_block,
                                                              continue_block))
        return error;
    } break;
    case spv::Op::OpSelectionMerge: {
      uint32_t merge_block = inst->GetOperandAs<uint32_t>(0);
      CFG_ASSERT(MergeBlockAssert, merge_block);

      if (auto error = _.current_function().RegisterSelectionMerge(merge_block))
        return error;
    } break;
    case spv::Op::OpBranch: {
      uint32_t target = inst->GetOperandAs<uint32_t>(0);
      CFG_ASSERT(FirstBlockAssert, target);

      _.current_function().RegisterBlockEnd({target});
    } break;
    case spv::Op::OpBranchConditional: {
      uint32_t tlabel = inst->GetOperandAs<uint32_t>(1);
      uint32_t flabel = inst->GetOperandAs<uint32_t>(2);
      CFG_ASSERT(FirstBlockAssert, tlabel);
      CFG_ASSERT(FirstBlockAssert, flabel);

      _.current_function().RegisterBlockEnd({tlabel, flabel});
    } break;

    case spv::Op::OpSwitch: {
      std::vector<uint32_t> cases;
      for (size_t i = 1; i < inst->operands().size(); i += 2) {
        uint32_t target = inst->GetOperandAs<uint32_t>(i);
        CFG_ASSERT(FirstBlockAssert, target);
        cases.push_back(target);
      }
      _.current_function().RegisterBlockEnd({cases});
    } break;
    case spv::Op::OpReturn: {
      const uint32_t return_type = _.current_function().GetResultTypeId();
      const Instruction* return_type_inst = _.FindDef(return_type);
      assert(return_type_inst);
      if (return_type_inst->opcode() != spv::Op::OpTypeVoid)
        return _.diag(SPV_ERROR_INVALID_CFG, inst)
               << "OpReturn can only be called from a function with void "
               << "return type.";
      _.current_function().RegisterBlockEnd(std::vector<uint32_t>());
      break;
    }
    case spv::Op::OpKill:
    case spv::Op::OpReturnValue:
    case spv::Op::OpUnreachable:
    case spv::Op::OpTerminateInvocation:
    case spv::Op::OpIgnoreIntersectionKHR:
    case spv::Op::OpTerminateRayKHR:
    case spv::Op::OpEmitMeshTasksEXT:
      _.current_function().RegisterBlockEnd(std::vector<uint32_t>());
      // Ops with dedicated passes check for the Execution Model there
      if (opcode == spv::Op::OpKill) {
        _.current_function().RegisterExecutionModelLimitation(
            spv::ExecutionModel::Fragment,
            "OpKill requires Fragment execution model");
      }
      if (opcode == spv::Op::OpTerminateInvocation) {
        _.current_function().RegisterExecutionModelLimitation(
            spv::ExecutionModel::Fragment,
            "OpTerminateInvocation requires Fragment execution model");
      }
      if (opcode == spv::Op::OpIgnoreIntersectionKHR) {
        _.current_function().RegisterExecutionModelLimitation(
            spv::ExecutionModel::AnyHitKHR,
            "OpIgnoreIntersectionKHR requires AnyHitKHR execution model");
      }
      if (opcode == spv::Op::OpTerminateRayKHR) {
        _.current_function().RegisterExecutionModelLimitation(
            spv::ExecutionModel::AnyHitKHR,
            "OpTerminateRayKHR requires AnyHitKHR execution model");
      }

      break;
    default:
      break;
  }
  return SPV_SUCCESS;
}